

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS
ref_node_tri_dquality_dnode0(REF_NODE ref_node,REF_INT *nodes,REF_DBL *quality,REF_DBL *d_quality)

{
  REF_DBL RVar1;
  REF_DBL RVar2;
  uint uVar3;
  REF_DBL *pRVar4;
  REF_DBL *pRVar5;
  undefined8 uVar6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  long lVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  REF_DBL det;
  double local_3c8;
  REF_DBL area;
  REF_DBL e2 [3];
  REF_DBL e1 [3];
  REF_DBL e0 [3];
  REF_DBL jac [9];
  REF_DBL d_num [3];
  double adStack_2b0 [7];
  REF_DBL d_area [3];
  REF_DBL xyz2 [3];
  REF_DBL d_denom [3];
  double adStack_1f0 [7];
  double adStack_1b8 [4];
  REF_DBL da [3];
  REF_DBL d_area_in_metric [3];
  double adStack_160 [7];
  REF_DBL l2;
  REF_DBL l1;
  REF_DBL l0;
  REF_DBL d_l1 [3];
  REF_DBL d_l0 [3];
  
  if (ref_node->tri_quality == 2) {
    ref_node_metric_get_log(ref_node,*nodes,d_l0);
    ref_node_metric_get_log(ref_node,nodes[1],d_l1);
    ref_node_metric_get_log(ref_node,nodes[2],&l0);
    for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
      (&l1)[lVar10] = (d_l0[lVar10] + d_l1[lVar10] + (&l0)[lVar10]) / 3.0;
    }
    uVar3 = ref_matrix_exp_m(&l1,&l2);
    if (uVar3 == 0) {
      uVar3 = ref_matrix_jacob_m(&l2,jac);
      if (uVar3 == 0) {
        uVar3 = ref_matrix_vect_mult(jac,ref_node->real + (long)*nodes * 0xf,&det);
        if (uVar3 == 0) {
          uVar3 = ref_matrix_vect_mult(jac,ref_node->real + (long)nodes[1] * 0xf,&area);
          if (uVar3 == 0) {
            uVar3 = ref_matrix_vect_mult(jac,ref_node->real + (long)nodes[2] * 0xf,xyz2);
            if (uVar3 == 0) {
              d_area[0] = jac[0];
              d_area[1] = jac[1];
              d_area[2] = jac[2];
              for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
                e0[lVar10] = xyz2[lVar10] - (&area)[lVar10];
              }
              for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
                e1[lVar10] = (&det)[lVar10] - xyz2[lVar10];
              }
              for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
                e2[lVar10] = (&area)[lVar10] - (&det)[lVar10];
              }
              pRVar4 = d_area_in_metric;
              pRVar5 = d_area;
              for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
                for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
                  pRVar4[lVar8] = pRVar5[lVar8];
                }
                pRVar4 = pRVar4 + 3;
                pRVar5 = pRVar5 + 3;
              }
              pRVar4 = d_num;
              pRVar5 = d_area;
              for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
                for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
                  pRVar4[lVar8] = -pRVar5[lVar8];
                }
                pRVar4 = pRVar4 + 3;
                pRVar5 = pRVar5 + 3;
              }
              for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
                dVar18 = adStack_2b0[lVar10 + 3];
                d_denom[lVar10] = adStack_2b0[lVar10] * e0[2] - e0[1] * dVar18;
                adStack_1f0[lVar10] = dVar18 * e0[0] - e0[2] * d_num[lVar10];
                adStack_1f0[lVar10 + 3] = d_num[lVar10] * e0[1] - e0[0] * adStack_2b0[lVar10];
              }
              for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
                adStack_1b8[lVar10] =
                     adStack_2b0[lVar10 + 3] * (e2[2] + e2[2]) +
                     adStack_2b0[lVar10] * (e2[1] + e2[1]) +
                     d_num[lVar10] * (e2[0] + e2[0]) +
                     adStack_160[lVar10 + 3] * (e1[2] + e1[2]) +
                     d_area_in_metric[lVar10] * (e1[0] + e1[0]) +
                     adStack_160[lVar10] * (e1[1] + e1[1]);
              }
              dVar19 = e2[2] * e0[0] + -e2[0] * e0[2];
              dVar18 = e2[1] * e0[2] + -e2[2] * e0[1];
              dVar13 = e2[0] * e0[1] + -e2[1] * e0[0];
              dVar17 = SQRT(dVar13 * dVar13 + dVar18 * dVar18 + dVar19 * dVar19);
              for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
                da[lVar10] = (adStack_1f0[lVar10 + 3] * (dVar13 + dVar13) +
                             d_denom[lVar10] * (dVar18 + dVar18) +
                             adStack_1f0[lVar10] * (dVar19 + dVar19)) * (0.25 / dVar17);
              }
              dVar18 = e0[2] * e0[2] + e0[0] * e0[0] + e0[1] * e0[1] +
                       e1[2] * e1[2] + e1[0] * e1[0] + e1[1] * e1[1] +
                       e2[2] * e2[2] + e2[0] * e2[0] + e2[1] * e2[1];
              dVar17 = dVar17 * 0.5;
              auVar15._8_8_ = dVar17;
              auVar15._0_8_ = dVar18 * 1e+20;
              auVar16._8_4_ = SUB84(dVar17,0);
              auVar16._0_8_ = -(dVar18 * 1e+20);
              auVar16._12_4_ = (int)((ulong)-dVar17 >> 0x20);
              auVar16 = maxpd(auVar15,auVar16);
              if (auVar16._0_8_ <= auVar16._8_8_) {
                *quality = -1.0;
              }
              else {
                *quality = (dVar17 / dVar18) * 6.928203230275509;
                for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
                  d_quality[lVar10] =
                       (((da[lVar10] * dVar18 + adStack_1b8[lVar10] * -dVar17) * 6.928203230275509)
                       / dVar18) / dVar18;
                }
              }
              return 0;
            }
            uVar7 = (ulong)uVar3;
            pcVar9 = "xyz2";
            uVar6 = 0x85f;
          }
          else {
            uVar7 = (ulong)uVar3;
            pcVar9 = "xyz1";
            uVar6 = 0x85d;
          }
        }
        else {
          uVar7 = (ulong)uVar3;
          pcVar9 = "xyz0";
          uVar6 = 0x85b;
        }
      }
      else {
        uVar7 = (ulong)uVar3;
        pcVar9 = "jac";
        uVar6 = 0x858;
      }
    }
    else {
      uVar7 = (ulong)uVar3;
      pcVar9 = "exp";
      uVar6 = 0x857;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar6,
           "ref_node_tri_jac_dquality_dnode0",uVar7,pcVar9);
    uVar6 = 0x8a3;
  }
  else {
    if (ref_node->tri_quality != 1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x8a6,
             "ref_node_tri_dquality_dnode0","case not recognized");
      return 1;
    }
    uVar3 = ref_node_dratio_dnode0(ref_node,*nodes,nodes[1],&l0,d_l0);
    if (uVar3 == 0) {
      uVar3 = ref_node_dratio_dnode0(ref_node,*nodes,nodes[2],&l1,d_l1);
      if (uVar3 == 0) {
        uVar3 = ref_node_ratio(ref_node,nodes[1],nodes[2],&l2);
        if (uVar3 == 0) {
          uVar3 = ref_node_tri_darea_dnode0(ref_node,nodes,&area,d_area);
          if (uVar3 == 0) {
            ref_node_metric_get(ref_node,*nodes,jac);
            uVar3 = ref_matrix_det_m(jac,&det);
            RVar1 = det;
            if (uVar3 == 0) {
              ref_node_metric_get(ref_node,nodes[1],jac);
              uVar3 = ref_matrix_det_m(jac,&det);
              RVar2 = det;
              if (uVar3 == 0) {
                ref_node_metric_get(ref_node,nodes[2],jac);
                uVar3 = ref_matrix_det_m(jac,&det);
                if (uVar3 == 0) {
                  uVar11 = SUB84(RVar1,0);
                  uVar12 = (undefined4)((ulong)RVar1 >> 0x20);
                  if (RVar2 <= RVar1) {
                    uVar11 = SUB84(RVar2,0);
                    uVar12 = (undefined4)((ulong)RVar2 >> 0x20);
                  }
                  if (det <= (double)CONCAT44(uVar12,uVar11)) {
                    uVar11 = SUB84(det,0);
                    uVar12 = (undefined4)((ulong)det >> 0x20);
                  }
                  dVar18 = pow((double)CONCAT44(uVar12,uVar11),0.3333333333333333);
                  local_3c8 = area;
                  for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
                    dVar17 = pow((double)CONCAT44(uVar12,uVar11),0.3333333333333333);
                    d_area_in_metric[lVar10] = dVar17 * d_area[lVar10];
                  }
                  for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
                    d_num[lVar10] = d_area_in_metric[lVar10];
                  }
                  for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
                    d_denom[lVar10] = d_l0[lVar10] * (l0 + l0) + d_l1[lVar10] * (l1 + l1);
                  }
                  dVar18 = dVar18 * local_3c8;
                  dVar17 = l2 * l2 + l0 * l0 + l1 * l1;
                  dVar13 = dVar17 * 1e+20;
                  if (dVar13 <= -dVar13) {
                    dVar13 = -dVar13;
                  }
                  dVar19 = -dVar18;
                  dVar14 = dVar18;
                  if (dVar18 <= dVar19) {
                    dVar14 = dVar19;
                  }
                  if (dVar14 < dVar13) {
                    *quality = (dVar18 * 6.9282032302755105) / dVar17;
                    for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
                      d_quality[lVar10] =
                           (((d_num[lVar10] * dVar17 + d_denom[lVar10] * dVar19) *
                            6.9282032302755105) / dVar17) / dVar17;
                    }
                    return 0;
                  }
                  *quality = -1.0;
                  for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
                    d_quality[lVar10] = 0.0;
                  }
                  return 0;
                }
                uVar7 = (ulong)uVar3;
                pcVar9 = "n2";
                uVar6 = 0x82b;
              }
              else {
                uVar7 = (ulong)uVar3;
                pcVar9 = "n1";
                uVar6 = 0x827;
              }
            }
            else {
              uVar7 = (ulong)uVar3;
              pcVar9 = "n0";
              uVar6 = 0x823;
            }
          }
          else {
            uVar7 = (ulong)uVar3;
            pcVar9 = "area";
            uVar6 = 0x820;
          }
        }
        else {
          uVar7 = (ulong)uVar3;
          pcVar9 = "l2";
          uVar6 = 0x81e;
        }
      }
      else {
        uVar7 = (ulong)uVar3;
        pcVar9 = "l1";
        uVar6 = 0x81d;
      }
    }
    else {
      uVar7 = (ulong)uVar3;
      pcVar9 = "l0";
      uVar6 = 0x81c;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar6,
           "ref_node_tri_epic_dquality_dnode0",uVar7,pcVar9);
    uVar6 = 0x89f;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar6,
         "ref_node_tri_dquality_dnode0",uVar7,"epic");
  return (REF_STATUS)uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_dquality_dnode0(REF_NODE ref_node,
                                                REF_INT *nodes,
                                                REF_DBL *quality,
                                                REF_DBL *d_quality) {
  switch (ref_node->tri_quality) {
    case REF_NODE_EPIC_QUALITY:
      RSS(ref_node_tri_epic_dquality_dnode0(ref_node, nodes, quality,
                                            d_quality),
          "epic");
      break;
    case REF_NODE_JAC_QUALITY:
      RSS(ref_node_tri_jac_dquality_dnode0(ref_node, nodes, quality, d_quality),
          "epic");
      break;
    default:
      THROW("case not recognized");
  }
  return REF_SUCCESS;
}